

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
pstack::ReaderArray<unsigned_long,_131072UL>::ReaderArray
          (ReaderArray<unsigned_long,_131072UL> *this,Reader *reader_,size_t offset)

{
  long lVar1;
  ulong uVar2;
  Exception *this_00;
  Exception local_1c0;
  
  this->reader = reader_;
  this->base = offset;
  this->cacheStart = 0;
  this->cacheEnd = 0;
  lVar1 = (**(code **)(*(long *)reader_ + 0x40))(reader_);
  this->eof = lVar1 - this->base >> 3;
  lVar1 = (**(code **)(*(long *)this->reader + 0x40))();
  if (lVar1 != -1) {
    uVar2 = (**(code **)(*(long *)this->reader + 0x40))();
    if ((uVar2 & 7) != 0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_1c0,0,0x1a0);
      Exception::Exception(&local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c0.str,"end of data while reading array",0x1f);
      Exception::Exception(this_00,&local_1c0);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

ReaderArray(const Reader &reader_, size_t offset = 0) :
         reader(reader_),
         base(offset),
         eof( ( reader.size() - base ) / sizeof(T) ) {
      if(reader.size() != std::numeric_limits<size_t>::max() && reader.size() % sizeof (T) != 0) {
         throw ( Exception() << "end of data while reading array" );
      }
   }